

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertStrUtil.cpp
# Opt level: O0

wstring * lzstring::to_wstring(wstring *__return_storage_ptr__,string *src)

{
  char *pcVar1;
  size_type __n;
  wchar_t *__pwcs;
  size_t __n_00;
  __normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_70;
  wchar_t *local_68;
  __normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_60;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<wchar_t,_std::allocator<wchar_t>_> tmp;
  size_t wcs_len;
  string *src_local;
  wstring *dest;
  
  setlocale(0,"zh_CN");
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  tmp.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl._16_8_ =
       mbstowcs((wchar_t *)0x0,pcVar1,0);
  __n = tmp.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl._16_8_ + 1;
  std::allocator<wchar_t>::allocator();
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_40,__n,&local_41);
  std::allocator<wchar_t>::~allocator(&local_41);
  __pwcs = std::vector<wchar_t,_std::allocator<wchar_t>_>::operator[]
                     ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_40,0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __n_00 = std::__cxx11::string::size();
  mbstowcs(__pwcs,pcVar1,__n_00);
  local_60._M_current =
       (wchar_t *)
       std::vector<wchar_t,_std::allocator<wchar_t>_>::begin
                 ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_40);
  local_70._M_current =
       (wchar_t *)
       std::vector<wchar_t,_std::allocator<wchar_t>_>::end
                 ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_40);
  local_68 = (wchar_t *)
             __gnu_cxx::
             __normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::
             operator-(&local_70,1);
  std::__cxx11::wstring::
  assign<__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
            ((wstring *)__return_storage_ptr__,local_60,
             (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)local_68
            );
  std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_wstring(std::string const &src)
{
    //   std::setlocale(LC_CTYPE, "");
    std::setlocale(LC_CTYPE, "zh_CN");

    std::wstring dest;
    size_t const wcs_len = mbstowcs(NULL, src.c_str(), 0);
    std::vector<wchar_t> tmp(wcs_len + 1);
    mbstowcs(&tmp[0], src.c_str(), src.size());

    dest.assign(tmp.begin(), tmp.end() - 1);

    return dest;
}